

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O3

void cftf161(double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  
  dVar1 = a[2] + a[0x12];
  dVar2 = a[3] + a[0x13];
  dVar8 = a[10] + a[0x1a];
  dVar9 = a[0xb] + a[0x1b];
  dVar5 = a[4] + a[0x14];
  dVar7 = a[5] + a[0x15];
  dVar11 = a[0xc] + a[0x1c];
  dVar12 = a[0xd] + a[0x1d];
  dVar30 = a[5] - a[0x15];
  dVar31 = a[0xc] - a[0x1c];
  dVar13 = a[4] - a[0x14];
  dVar16 = a[0xd] - a[0x1d];
  dVar10 = dVar13 - dVar16;
  dVar6 = dVar30 + dVar31;
  dVar16 = dVar16 + dVar13;
  dVar30 = dVar30 - dVar31;
  dVar37 = a[6] + a[0x16];
  dVar38 = a[7] + a[0x17];
  dVar31 = a[0xe] + a[0x1e];
  dVar17 = a[0xf] + a[0x1f];
  dVar27 = dVar2 - dVar9;
  dVar28 = dVar37 - dVar31;
  dVar13 = dVar1 + dVar8;
  dVar2 = dVar2 + dVar9;
  dVar37 = dVar37 + dVar31;
  dVar21 = dVar38 + dVar17;
  dVar1 = dVar1 - dVar8;
  dVar38 = dVar38 - dVar17;
  dVar14 = *a + a[0x10];
  dVar18 = a[1] + a[0x11];
  dVar8 = *a - a[0x10];
  dVar9 = a[1] - a[0x11];
  dVar20 = a[8] + a[0x18];
  dVar22 = a[9] + a[0x19];
  dVar15 = a[8] - a[0x18];
  dVar19 = a[9] - a[0x19];
  dVar31 = dVar8 - dVar19;
  dVar17 = dVar9 - dVar15;
  dVar19 = dVar19 + dVar8;
  dVar15 = dVar15 + dVar9;
  dVar8 = a[2] - a[0x12];
  dVar9 = a[3] - a[0x13];
  dVar3 = a[10] - a[0x1a];
  dVar4 = a[0xb] - a[0x1b];
  dVar23 = dVar8 - dVar4;
  dVar24 = dVar9 - dVar3;
  dVar4 = dVar4 + dVar8;
  dVar3 = dVar3 + dVar9;
  dVar8 = w[3];
  dVar9 = w[2];
  dVar25 = dVar23 * dVar9 + dVar3 * -dVar8;
  dVar26 = dVar3 * dVar9 + dVar23 * dVar8;
  dVar23 = a[6] - a[0x16];
  dVar33 = a[7] - a[0x17];
  dVar35 = a[0xe] - a[0x1e];
  dVar36 = a[0xf] - a[0x1f];
  dVar3 = dVar23 - dVar36;
  dVar29 = dVar33 - dVar35;
  dVar36 = dVar36 + dVar23;
  dVar35 = dVar35 + dVar33;
  dVar32 = dVar3 * dVar8 + dVar35 * -dVar9;
  dVar34 = dVar35 * dVar8 + dVar3 * dVar9;
  dVar23 = dVar4 * dVar8 + dVar24 * -dVar9;
  dVar4 = dVar24 * dVar8 + dVar4 * dVar9;
  dVar24 = dVar36 * dVar9 + dVar29 * -dVar8;
  dVar29 = dVar29 * dVar9 + dVar36 * dVar8;
  dVar3 = dVar1 - dVar38;
  dVar38 = dVar38 + dVar1;
  dVar1 = dVar27 - dVar28;
  dVar8 = w[1];
  dVar9 = (dVar38 - dVar1) * dVar8;
  dVar33 = (dVar1 + dVar38) * dVar8;
  dVar1 = (dVar30 + dVar16) * dVar8;
  dVar38 = (dVar30 - dVar16) * dVar8;
  dVar16 = dVar19 - dVar1;
  dVar30 = dVar17 - dVar38;
  dVar35 = dVar23 - dVar24;
  dVar36 = dVar4 - dVar29;
  a[0x18] = dVar16 + dVar35;
  a[0x19] = dVar30 + dVar36;
  a[0x1a] = dVar16 - dVar35;
  a[0x1b] = dVar30 - dVar36;
  dVar19 = dVar19 + dVar1;
  dVar17 = dVar17 + dVar38;
  dVar24 = dVar24 + dVar23;
  dVar29 = dVar29 + dVar4;
  a[0x1c] = dVar19 - dVar29;
  a[0x1d] = dVar24 + dVar17;
  a[0x1e] = dVar29 + dVar19;
  a[0x1f] = dVar17 - dVar24;
  dVar4 = (dVar10 - dVar6) * dVar8;
  dVar23 = (dVar6 + dVar10) * dVar8;
  dVar1 = dVar31 + dVar4;
  dVar17 = dVar15 + dVar23;
  dVar6 = dVar25 + dVar32;
  dVar38 = dVar26 + dVar34;
  a[0x10] = dVar1 + dVar6;
  a[0x11] = dVar17 + dVar38;
  a[0x12] = dVar1 - dVar6;
  a[0x13] = dVar17 - dVar38;
  dVar31 = dVar31 - dVar4;
  dVar15 = dVar15 - dVar23;
  dVar25 = dVar25 - dVar32;
  dVar26 = dVar26 - dVar34;
  a[0x14] = dVar31 - dVar26;
  a[0x15] = dVar25 + dVar15;
  a[0x16] = dVar26 + dVar31;
  a[0x17] = dVar15 - dVar25;
  dVar27 = dVar27 + dVar28;
  dVar17 = dVar14 + dVar20;
  dVar4 = dVar18 + dVar22;
  dVar14 = dVar14 - dVar20;
  dVar18 = dVar18 - dVar22;
  dVar6 = dVar5 + dVar11;
  dVar23 = dVar7 + dVar12;
  dVar5 = dVar5 - dVar11;
  dVar7 = dVar7 - dVar12;
  dVar38 = (dVar3 - dVar27) * dVar8;
  dVar8 = (dVar27 + dVar3) * dVar8;
  dVar1 = dVar14 - dVar7;
  dVar31 = dVar18 - dVar5;
  dVar7 = dVar7 + dVar14;
  dVar5 = dVar5 + dVar18;
  a[8] = dVar1 + dVar38;
  a[9] = dVar5 + dVar8;
  a[10] = dVar1 - dVar38;
  a[0xb] = dVar5 - dVar8;
  a[0xc] = dVar7 - dVar33;
  a[0xd] = dVar31 + dVar9;
  a[0xe] = dVar7 + dVar33;
  a[0xf] = dVar31 - dVar9;
  dVar8 = dVar17 + dVar6;
  dVar9 = dVar4 + dVar23;
  dVar1 = dVar13 + dVar37;
  dVar31 = dVar2 + dVar21;
  *a = dVar8 + dVar1;
  a[1] = dVar9 + dVar31;
  a[2] = dVar8 - dVar1;
  a[3] = dVar9 - dVar31;
  dVar17 = dVar17 - dVar6;
  dVar4 = dVar4 - dVar23;
  dVar13 = dVar13 - dVar37;
  dVar2 = dVar2 - dVar21;
  a[4] = dVar17 - dVar2;
  a[5] = dVar13 + dVar4;
  a[6] = dVar2 + dVar17;
  a[7] = dVar4 - dVar13;
  return;
}

Assistant:

void cftf161(FFTFLT *a, FFTFLT *w)
{
    FFTFLT wn4r, wk1r, wk1i,
        x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
        y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
        y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i,
        y8r, y8i, y9r, y9i, y10r, y10i, y11r, y11i,
        y12r, y12i, y13r, y13i, y14r, y14i, y15r, y15i;

    wn4r = w[1];
    wk1r = w[2];
    wk1i = w[3];
    x0r = a[0] + a[16];
    x0i = a[1] + a[17];
    x1r = a[0] - a[16];
    x1i = a[1] - a[17];
    x2r = a[8] + a[24];
    x2i = a[9] + a[25];
    x3r = a[8] - a[24];
    x3i = a[9] - a[25];
    y0r = x0r + x2r;
    y0i = x0i + x2i;
    y4r = x0r - x2r;
    y4i = x0i - x2i;
    y8r = x1r - x3i;
    y8i = x1i + x3r;
    y12r = x1r + x3i;
    y12i = x1i - x3r;
    x0r = a[2] + a[18];
    x0i = a[3] + a[19];
    x1r = a[2] - a[18];
    x1i = a[3] - a[19];
    x2r = a[10] + a[26];
    x2i = a[11] + a[27];
    x3r = a[10] - a[26];
    x3i = a[11] - a[27];
    y1r = x0r + x2r;
    y1i = x0i + x2i;
    y5r = x0r - x2r;
    y5i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y9r = wk1r * x0r - wk1i * x0i;
    y9i = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y13r = wk1i * x0r - wk1r * x0i;
    y13i = wk1i * x0i + wk1r * x0r;
    x0r = a[4] + a[20];
    x0i = a[5] + a[21];
    x1r = a[4] - a[20];
    x1i = a[5] - a[21];
    x2r = a[12] + a[28];
    x2i = a[13] + a[29];
    x3r = a[12] - a[28];
    x3i = a[13] - a[29];
    y2r = x0r + x2r;
    y2i = x0i + x2i;
    y6r = x0r - x2r;
    y6i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y10r = wn4r * (x0r - x0i);
    y10i = wn4r * (x0i + x0r);
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y14r = wn4r * (x0r + x0i);
    y14i = wn4r * (x0i - x0r);
    x0r = a[6] + a[22];
    x0i = a[7] + a[23];
    x1r = a[6] - a[22];
    x1i = a[7] - a[23];
    x2r = a[14] + a[30];
    x2i = a[15] + a[31];
    x3r = a[14] - a[30];
    x3i = a[15] - a[31];
    y3r = x0r + x2r;
    y3i = x0i + x2i;
    y7r = x0r - x2r;
    y7i = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    y11r = wk1i * x0r - wk1r * x0i;
    y11i = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    y15r = wk1r * x0r - wk1i * x0i;
    y15i = wk1r * x0i + wk1i * x0r;
    x0r = y12r - y14r;
    x0i = y12i - y14i;
    x1r = y12r + y14r;
    x1i = y12i + y14i;
    x2r = y13r - y15r;
    x2i = y13i - y15i;
    x3r = y13r + y15r;
    x3i = y13i + y15i;
    a[24] = x0r + x2r;
    a[25] = x0i + x2i;
    a[26] = x0r - x2r;
    a[27] = x0i - x2i;
    a[28] = x1r - x3i;
    a[29] = x1i + x3r;
    a[30] = x1r + x3i;
    a[31] = x1i - x3r;
    x0r = y8r + y10r;
    x0i = y8i + y10i;
    x1r = y8r - y10r;
    x1i = y8i - y10i;
    x2r = y9r + y11r;
    x2i = y9i + y11i;
    x3r = y9r - y11r;
    x3i = y9i - y11i;
    a[16] = x0r + x2r;
    a[17] = x0i + x2i;
    a[18] = x0r - x2r;
    a[19] = x0i - x2i;
    a[20] = x1r - x3i;
    a[21] = x1i + x3r;
    a[22] = x1r + x3i;
    a[23] = x1i - x3r;
    x0r = y5r - y7i;
    x0i = y5i + y7r;
    x2r = wn4r * (x0r - x0i);
    x2i = wn4r * (x0i + x0r);
    x0r = y5r + y7i;
    x0i = y5i - y7r;
    x3r = wn4r * (x0r - x0i);
    x3i = wn4r * (x0i + x0r);
    x0r = y4r - y6i;
    x0i = y4i + y6r;
    x1r = y4r + y6i;
    x1i = y4i - y6r;
    a[8] = x0r + x2r;
    a[9] = x0i + x2i;
    a[10] = x0r - x2r;
    a[11] = x0i - x2i;
    a[12] = x1r - x3i;
    a[13] = x1i + x3r;
    a[14] = x1r + x3i;
    a[15] = x1i - x3r;
    x0r = y0r + y2r;
    x0i = y0i + y2i;
    x1r = y0r - y2r;
    x1i = y0i - y2i;
    x2r = y1r + y3r;
    x2i = y1i + y3i;
    x3r = y1r - y3r;
    x3i = y1i - y3i;
    a[0] = x0r + x2r;
    a[1] = x0i + x2i;
    a[2] = x0r - x2r;
    a[3] = x0i - x2i;
    a[4] = x1r - x3i;
    a[5] = x1i + x3r;
    a[6] = x1r + x3i;
    a[7] = x1i - x3r;
}